

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cpp
# Opt level: O0

void __thiscall r_exec::_Fact::set_opposite(_Fact *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Atom local_28 [20];
  Atom local_14 [4];
  _Fact *local_10;
  _Fact *this_local;
  
  local_10 = this;
  bVar1 = is_fact(this);
  if (bVar1) {
    r_code::Atom::Object((ushort)local_14,(uchar)Opcodes::AntiFact);
    iVar2 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[4])(this,0);
    r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar2),local_14);
    r_code::Atom::~Atom(local_14);
  }
  else {
    r_code::Atom::Object((ushort)local_28,(uchar)Opcodes::Fact);
    iVar2 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[4])(this,0);
    r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_00,iVar2),local_28);
    r_code::Atom::~Atom(local_28);
  }
  return;
}

Assistant:

void _Fact::set_opposite()
{
    if (is_fact()) {
        code(0) = Atom::Object(Opcodes::AntiFact, FACT_ARITY);
    } else {
        code(0) = Atom::Object(Opcodes::Fact, FACT_ARITY);
    }
}